

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_pri_stack_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  long lVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  REF_INT RVar24;
  long lVar25;
  int iVar26;
  undefined8 uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  char *pcVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  REF_INT local_88;
  int local_84 [23];
  
  uVar23 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar23 != 0) {
    uVar34 = (ulong)uVar23;
    pcVar31 = "create";
    uVar27 = 0x303;
    goto LAB_0012d0ba;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar30 = ref_mpi->id;
  lVar29 = (long)ref_mpi->n;
  iVar26 = 0;
  lVar32 = (long)(int)(0xb / (long)ref_mpi->n);
  lVar28 = lVar32 * lVar29;
  if (0xb < lVar28) {
    iVar26 = ((int)((((lVar29 + 0xb) / lVar29) * (lVar28 + -0xc)) / lVar32) - (int)lVar28) + 0xc;
  }
  if (iVar30 == iVar26) {
LAB_0012b230:
    uVar23 = ref_node_add(ref_node,0,&local_98);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x319;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_98;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 0.0;
    if ((lVar29 < 0) || (ref_node->max <= local_98)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar5 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,1,&local_94);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x31a;
      goto LAB_0012d0ba;
    }
    pRVar4 = ref_node->real;
    lVar29 = (long)local_94;
    pRVar4[lVar29 * 0xf] = 1.0;
    pRVar4 = pRVar4 + lVar29 * 0xf + 1;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    if ((lVar29 < 0) || (ref_node->max <= local_94)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar6 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,2,&local_90);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x31b;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_90;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 0.0;
    if ((lVar29 < 0) || (ref_node->max <= local_90)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar7 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,3,&local_8c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x31c;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_8c;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_8c)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar8 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,4,&local_88);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x31d;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_88;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 1.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_88)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar9 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,5,local_84);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x31e;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_84[0];
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_84[0])) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar10 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_cell_add(pRVar1->cell[10],&local_98,&local_9c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add prism";
      uVar27 = 800;
      goto LAB_0012d0ba;
    }
    iVar30 = ref_mpi->id;
    lVar28 = (long)ref_mpi->n;
    lVar29 = (lVar28 + 0xb) / lVar28;
    lVar32 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar28 = 0xc - lVar28 * lVar32;
  }
  else {
    lVar29 = (lVar29 + 0xb) / lVar29;
    lVar25 = 0;
    if (lVar29 + 1U < 3) {
      lVar25 = lVar29;
    }
    lVar28 = 0xc - lVar28;
    if (lVar28 <= lVar25) {
      lVar25 = (1 - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012b230;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (2 - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012b230;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (3 - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012b230;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (4 - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012b230;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (5 - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012b230;
  }
  lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar29),0);
  if (lVar28 <= lVar25) {
    lVar25 = (3 - lVar28 * lVar29) / lVar32 + lVar28;
  }
  if (iVar30 == (int)lVar25) {
LAB_0012ba8e:
    uVar23 = ref_node_add(ref_node,3,&local_98);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x335;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_98;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_98)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar11 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,4,&local_94);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x336;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_94;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 1.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_94)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar12 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,5,&local_90);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x337;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_90;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 1.0;
    if ((lVar29 < 0) || (ref_node->max <= local_90)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar13 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,6,&local_8c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x338;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_8c;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_8c)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar14 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,7,&local_88);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x339;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_88;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 1.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_88)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar15 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,8,local_84);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x33a;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_84[0];
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_84[0])) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar16 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_cell_add(pRVar1->cell[10],&local_98,&local_9c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add prism";
      uVar27 = 0x33c;
      goto LAB_0012d0ba;
    }
    iVar30 = ref_mpi->id;
    lVar28 = (long)ref_mpi->n;
    lVar29 = (lVar28 + 0xb) / lVar28;
    lVar33 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar29),0);
    lVar32 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar28 = 0xc - lVar28 * lVar32;
  }
  else {
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (4 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012ba8e;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (5 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012ba8e;
    lVar33 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar29),0);
    lVar25 = lVar33;
    if (lVar28 <= lVar33) {
      lVar25 = (6 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012ba8e;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (7 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012ba8e;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (8 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012ba8e;
  }
  if (lVar28 <= lVar33) {
    lVar33 = (6 - lVar28 * lVar29) / lVar32 + lVar28;
  }
  if (iVar30 == (int)lVar33) {
LAB_0012c2f3:
    uVar23 = ref_node_add(ref_node,6,&local_98);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x351;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_98;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_98)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar17 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,7,&local_94);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x352;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_94;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 1.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_94)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar18 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,8,&local_90);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x353;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_90;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 2.0;
    if ((lVar29 < 0) || (ref_node->max <= local_90)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar19 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,9,&local_8c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x354;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_8c;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 3.0;
    if ((lVar29 < 0) || (ref_node->max <= local_8c)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar20 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,10,&local_88);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x355;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_88;
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *pRVar4 = 1.0;
    pRVar4[1] = 0.0;
    pRVar2[lVar29 * 0xf + 2] = 3.0;
    if ((lVar29 < 0) || (ref_node->max <= local_88)) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar21 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_node_add(ref_node,0xb,local_84);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add node";
      uVar27 = 0x356;
      goto LAB_0012d0ba;
    }
    pRVar2 = ref_node->real;
    lVar29 = (long)local_84[0];
    pRVar4 = pRVar2 + lVar29 * 0xf;
    *(undefined4 *)pRVar4 = 0;
    *(undefined4 *)((long)pRVar4 + 4) = 0;
    *(undefined4 *)(pRVar4 + 1) = 0;
    *(undefined4 *)((long)pRVar4 + 0xc) = 0x3ff00000;
    pRVar2[lVar29 * 0xf + 2] = 3.0;
    if ((lVar29 < 0) || (ref_node->max <= local_84[0])) {
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = SUB168(SEXT816(-1),8);
      lVar28 = SUB168((auVar22 << 0x40 | ZEXT816(0xffffffffffffffff)) / SEXT816(lVar25),0);
      lVar32 = -1;
    }
    else {
      lVar28 = ref_node->global[lVar29];
      if (lVar28 < 0) {
        lVar28 = -1;
      }
      iVar30 = ref_mpi->n;
      lVar33 = (long)iVar30;
      lVar25 = (lVar33 + 0xb) / lVar33;
      lVar28 = lVar28 / lVar25;
      lVar3 = ref_node->global[lVar29];
      lVar32 = -1;
      if (-1 < lVar3) {
        lVar32 = lVar3;
      }
    }
    if ((long)(0xb % (long)iVar30 & 0xffffffffU) < lVar28) {
      lVar28 = (long)(int)(0xb / (long)(int)lVar33);
      lVar33 = 0xc - lVar33 * lVar28;
      RVar24 = (int)((lVar32 - lVar25 * lVar33) / lVar28) + (int)lVar33;
    }
    else {
      RVar24 = (REF_INT)(lVar32 / lVar25);
    }
    ref_node->part[lVar29] = RVar24;
    uVar23 = ref_cell_add(pRVar1->cell[10],&local_98,&local_9c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add prism";
      uVar27 = 0x358;
      goto LAB_0012d0ba;
    }
  }
  else {
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (7 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012c2f3;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (8 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012c2f3;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (9 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012c2f3;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (10 - lVar28 * lVar29) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012c2f3;
    lVar25 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar29),0);
    if (lVar28 <= lVar25) {
      lVar25 = (0xb - lVar29 * lVar28) / lVar32 + lVar28;
    }
    if (iVar30 == (int)lVar25) goto LAB_0012c2f3;
  }
  uVar23 = ref_node_initialize_n_global(ref_node,0xc);
  if (uVar23 != 0) {
    uVar34 = (ulong)uVar23;
    pcVar31 = "glob";
    uVar27 = 0x35b;
    goto LAB_0012d0ba;
  }
  iVar30 = ref_mpi->id;
  lVar32 = (long)ref_mpi->n;
  lVar28 = (lVar32 + 0xb) / lVar32;
  lVar29 = 0;
  if (lVar28 + 1U < 3) {
    lVar29 = lVar28;
  }
  lVar25 = (long)(int)(0xb / (long)ref_mpi->n);
  lVar32 = lVar32 * lVar25;
  lVar33 = 0xc - lVar32;
  if (lVar33 <= lVar29) {
    lVar29 = (1 - lVar33 * lVar28) / lVar25 + lVar33;
  }
  if (iVar30 == (int)lVar29) {
LAB_0012cb1e:
    uVar23 = ref_node_local(ref_node,1,&local_98);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x36a;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,0,&local_94);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x36b;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,3,&local_90);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x36c;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,4,&local_8c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x36d;
      goto LAB_0012d0ba;
    }
    local_88 = 0x14;
    uVar23 = ref_cell_add(pRVar1->cell[6],&local_98,&local_9c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add quad";
      uVar27 = 0x36f;
      goto LAB_0012d0ba;
    }
    iVar30 = ref_mpi->id;
    lVar29 = (long)ref_mpi->n;
    lVar28 = (lVar29 + 0xb) / lVar29;
    lVar25 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar33 = 0xc - lVar29 * lVar25;
  }
  else {
    iVar26 = 0;
    if (0xb < lVar32) {
      iVar26 = ((int)(((lVar32 + -0xc) * lVar28) / lVar25) - (int)lVar32) + 0xc;
    }
    if (iVar30 == iVar26) goto LAB_0012cb1e;
    lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar28),0);
    if (lVar33 <= lVar29) {
      lVar29 = (3 - lVar33 * lVar28) / lVar25 + lVar33;
    }
    if (iVar30 == (int)lVar29) goto LAB_0012cb1e;
    lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar28),0);
    if (lVar33 <= lVar29) {
      lVar29 = (4 - lVar28 * lVar33) / lVar25 + lVar33;
    }
    if (iVar30 == (int)lVar29) goto LAB_0012cb1e;
  }
  lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar28),0);
  if (lVar33 <= lVar29) {
    lVar29 = (4 - lVar33 * lVar28) / lVar25 + lVar33;
  }
  if (iVar30 == (int)lVar29) {
LAB_0012cd4e:
    uVar23 = ref_node_local(ref_node,4,&local_98);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x37f;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,3,&local_94);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x380;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,6,&local_90);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x381;
      goto LAB_0012d0ba;
    }
    uVar23 = ref_node_local(ref_node,7,&local_8c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x382;
      goto LAB_0012d0ba;
    }
    local_88 = 0x14;
    uVar23 = ref_cell_add(pRVar1->cell[6],&local_98,&local_9c);
    if (uVar23 != 0) {
      uVar34 = (ulong)uVar23;
      pcVar31 = "add quad";
      uVar27 = 900;
      goto LAB_0012d0ba;
    }
    iVar30 = ref_mpi->id;
    lVar29 = (long)ref_mpi->n;
    lVar28 = (lVar29 + 0xb) / lVar29;
    lVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar28),0);
    lVar25 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar33 = 0xc - lVar29 * lVar25;
  }
  else {
    lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar28),0);
    if (lVar33 <= lVar29) {
      lVar29 = (3 - lVar33 * lVar28) / lVar25 + lVar33;
    }
    if (iVar30 == (int)lVar29) goto LAB_0012cd4e;
    lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar28),0);
    if (lVar33 <= lVar29) {
      lVar29 = (6 - lVar33 * lVar28) / lVar25 + lVar33;
    }
    if (iVar30 == (int)lVar29) goto LAB_0012cd4e;
    lVar32 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar28),0);
    lVar29 = lVar32;
    if (lVar33 <= lVar32) {
      lVar29 = (7 - lVar33 * lVar28) / lVar25 + lVar33;
    }
    if (iVar30 == (int)lVar29) goto LAB_0012cd4e;
  }
  if (lVar33 <= lVar32) {
    lVar32 = (7 - lVar33 * lVar28) / lVar25 + lVar33;
  }
  if (iVar30 != (int)lVar32) {
    lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar28),0);
    if (lVar33 <= lVar29) {
      lVar29 = (6 - lVar33 * lVar28) / lVar25 + lVar33;
    }
    if (iVar30 != (int)lVar29) {
      lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) / SEXT816(lVar28),0);
      if (lVar33 <= lVar29) {
        lVar29 = (9 - lVar33 * lVar28) / lVar25 + lVar33;
      }
      if (iVar30 != (int)lVar29) {
        lVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) / SEXT816(lVar28),0);
        if (lVar33 <= lVar29) {
          lVar29 = (10 - lVar28 * lVar33) / lVar25 + lVar33;
        }
        if (iVar30 != (int)lVar29) {
          return 0;
        }
      }
    }
  }
  uVar23 = ref_node_local(ref_node,7,&local_98);
  if (uVar23 == 0) {
    uVar23 = ref_node_local(ref_node,6,&local_94);
    if (uVar23 == 0) {
      uVar23 = ref_node_local(ref_node,9,&local_90);
      if (uVar23 == 0) {
        uVar23 = ref_node_local(ref_node,10,&local_8c);
        if (uVar23 == 0) {
          local_88 = 0x14;
          uVar23 = ref_cell_add(pRVar1->cell[6],&local_98,&local_9c);
          if (uVar23 == 0) {
            return 0;
          }
          uVar34 = (ulong)uVar23;
          pcVar31 = "add quad";
          uVar27 = 0x399;
        }
        else {
          uVar34 = (ulong)uVar23;
          pcVar31 = "loc";
          uVar27 = 0x397;
        }
      }
      else {
        uVar34 = (ulong)uVar23;
        pcVar31 = "loc";
        uVar27 = 0x396;
      }
    }
    else {
      uVar34 = (ulong)uVar23;
      pcVar31 = "loc";
      uVar27 = 0x395;
    }
  }
  else {
    uVar34 = (ulong)uVar23;
    pcVar31 = "loc";
    uVar27 = 0x394;
  }
LAB_0012d0ba:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar27,
         "ref_fixture_pri_stack_grid",uVar34,pcVar31);
  return (REF_STATUS)uVar34;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_stack_grid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_GLOB nnodesg = 12;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  global[4] = 7;
  global[5] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.0, 0.0, 2.0);
    add_that_node(4, 1.0, 0.0, 2.0);
    add_that_node(5, 0.0, 1.0, 2.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  global[4] = 10;
  global[5] = 11;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 2.0);
    add_that_node(1, 1.0, 0.0, 2.0);
    add_that_node(2, 0.0, 1.0, 2.0);
    add_that_node(3, 0.0, 0.0, 3.0);
    add_that_node(4, 1.0, 0.0, 3.0);
    add_that_node(5, 0.0, 1.0, 3.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "glob");

  global[0] = 1;
  global[1] = 0;
  global[2] = 3;
  global[3] = 4;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 4;
  global[1] = 3;
  global[2] = 6;
  global[3] = 7;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 7;
  global[1] = 6;
  global[2] = 9;
  global[3] = 10;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  return REF_SUCCESS;
}